

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O0

double statement(void)

{
  code *pcVar1;
  double dVar2;
  bool bVar3;
  string local_a0;
  Token local_80;
  double local_40;
  double result;
  Token t;
  
  Token_stream::get((Token *)&result,&ts);
  local_40 = 0.0;
  if (result._0_1_ == '#') {
    local_40 = declaration(false);
  }
  else if (result._0_1_ == 'C') {
    local_40 = declaration(true);
  }
  else {
    Token::Token(&local_80,(Token *)&result);
    Token_stream::unget(&ts,&local_80);
    Token::~Token(&local_80);
    local_40 = expression();
  }
  bVar3 = is_out_of_int32_range(local_40);
  dVar2 = local_40;
  if (!bVar3) {
    Token::~Token((Token *)&result);
    return dVar2;
  }
  compose_owerflow_err_msg_abi_cxx11_(&local_a0,local_40);
  error(&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

double statement()
{
	Token t = ts.get();
	double result = 0;
	switch (t.kind)
	{
	case let:
		result = declaration();
		break;
	case constant:
		result = declaration(true);
		break;
	default:
		ts.unget(t);
		result = expression();
	}

	if (is_out_of_int32_range(result))
		error(compose_owerflow_err_msg(result));
	else
		return result;
}